

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-chest.c
# Opt level: O0

char * chest_trap_name(object *obj)

{
  short sVar1;
  chest_trap *local_30;
  chest_trap *found;
  chest_trap *trap;
  int16_t trap_value;
  object *obj_local;
  
  sVar1 = obj->pval;
  if (sVar1 < 0) {
    obj_local = (object *)"disarmed";
    if (sVar1 == -1) {
      obj_local = (object *)"unlocked";
    }
  }
  else {
    if (0 < sVar1) {
      local_30 = (chest_trap *)0x0;
      for (found = chest_traps; found != (chest_trap *)0x0; found = found->next) {
        if (((int)sVar1 & found->pval) != 0) {
          if (local_30 != (chest_trap *)0x0) {
            obj_local = (object *)anon_var_dwarf_8d7d8;
            return (char *)obj_local;
          }
          local_30 = found;
        }
      }
      if (local_30 != (chest_trap *)0x0) {
        return local_30->name;
      }
    }
    obj_local = (object *)anon_var_dwarf_469ef;
  }
  return (char *)obj_local;
}

Assistant:

const char *chest_trap_name(const struct object *obj)
{
	int16_t trap_value = obj->pval;

	/* Non-zero value means there either were or are still traps */
	if (trap_value < 0) {
		return (trap_value == -1) ? "unlocked" : "disarmed";
	} else if (trap_value > 0) {
		struct chest_trap *trap = chest_traps, *found = NULL;
		while (trap) {
			if (trap_value & trap->pval) {
				if (found) {
					return "multiple traps";
				}
				found = trap;
			}
			trap = trap->next;
		}
		if (found) {
			return found->name;
		}
	}

	return "empty";
}